

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::addDestinationTarget
          (CommonCore *this,InterfaceHandle handle,string_view dest,InterfaceType hint)

{
  byte bVar1;
  ushort uVar2;
  BrokerObject *pBVar3;
  BrokerObject *pBVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar7;
  InvalidIdentifier *this_00;
  HelicsException *this_01;
  char *pcVar8;
  action_t newAction;
  size_t sVar9;
  string_view string1;
  string_view string1_00;
  string_view message;
  string_view message_00;
  string_view string2;
  string_view string2_00;
  undefined1 local_e0 [16];
  undefined8 local_d0;
  ulong local_c8;
  Time TStack_c0;
  Time local_b8;
  Time TStack_b0;
  Time local_a8;
  SmallBuffer SStack_a0;
  pointer pbStack_40;
  pointer local_38;
  pointer pbStack_30;
  
  sVar9 = dest._M_len;
  puVar7 = getHandleInfo(this,handle);
  if (puVar7 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar8 = "invalid handle";
    sVar9 = 0xe;
LAB_00303d2c:
    message._M_str = pcVar8;
    message._M_len = sVar9;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  uVar2 = *(ushort *)
           ((long)&puVar7[1]._M_t.
                   super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                   .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
  if ((uVar2 >> 0xe & 1) != 0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar8 = "Interface is receive only and cannot have destination targets";
    sVar9 = 0x3d;
    goto LAB_00303d2c;
  }
  SStack_a0.heap = (byte *)&SStack_a0;
  local_e0._0_4_ = cmd_ignore;
  local_e0._4_4_ = 0;
  local_d0._0_4_ = 0;
  local_d0._4_4_ = -1700000000;
  TStack_c0.internalTimeCode = 0;
  local_b8.internalTimeCode = 0;
  TStack_b0.internalTimeCode = 0;
  local_a8.internalTimeCode = 0;
  SStack_a0.buffer._M_elems[0] = 0;
  SStack_a0.buffer._M_elems[1] = 0;
  SStack_a0.buffer._M_elems[2] = 0;
  SStack_a0.buffer._M_elems[3] = 0;
  SStack_a0.buffer._M_elems[4] = 0;
  SStack_a0.buffer._M_elems[5] = 0;
  SStack_a0.buffer._M_elems[6] = 0;
  SStack_a0.buffer._M_elems[7] = 0;
  SStack_a0.buffer._M_elems[8] = 0;
  SStack_a0.buffer._M_elems[9] = 0;
  SStack_a0.buffer._M_elems[10] = 0;
  SStack_a0.buffer._M_elems[0xb] = 0;
  SStack_a0.buffer._M_elems[0xc] = 0;
  SStack_a0.buffer._M_elems[0xd] = 0;
  SStack_a0.buffer._M_elems[0xe] = 0;
  SStack_a0.buffer._M_elems[0xf] = 0;
  SStack_a0.buffer._M_elems[0x10] = 0;
  SStack_a0.buffer._M_elems[0x11] = 0;
  SStack_a0.buffer._M_elems[0x12] = 0;
  SStack_a0.buffer._M_elems[0x13] = 0;
  SStack_a0.buffer._M_elems[0x14] = 0;
  SStack_a0.buffer._M_elems[0x15] = 0;
  SStack_a0.buffer._M_elems[0x16] = 0;
  SStack_a0.buffer._M_elems[0x17] = 0;
  SStack_a0.buffer._M_elems[0x18] = 0;
  SStack_a0.buffer._M_elems[0x19] = 0;
  SStack_a0.buffer._M_elems[0x1a] = 0;
  SStack_a0.buffer._M_elems[0x1b] = 0;
  SStack_a0.buffer._M_elems[0x1c] = 0;
  SStack_a0.buffer._M_elems[0x1d] = 0;
  SStack_a0.buffer._M_elems[0x1e] = 0;
  SStack_a0.buffer._M_elems[0x1f] = 0;
  SStack_a0.buffer._M_elems[0x20] = 0;
  SStack_a0.buffer._M_elems[0x21] = 0;
  SStack_a0.buffer._M_elems[0x22] = 0;
  SStack_a0.buffer._M_elems[0x23] = 0;
  SStack_a0.buffer._M_elems[0x24] = 0;
  SStack_a0.buffer._M_elems[0x25] = 0;
  SStack_a0.buffer._M_elems[0x26] = 0;
  SStack_a0.buffer._M_elems[0x27] = 0;
  SStack_a0.buffer._M_elems[0x28] = 0;
  SStack_a0.buffer._M_elems[0x29] = 0;
  SStack_a0.buffer._M_elems[0x2a] = 0;
  SStack_a0.buffer._M_elems[0x2b] = 0;
  SStack_a0.buffer._M_elems[0x2c] = 0;
  SStack_a0.buffer._M_elems[0x2d] = 0;
  SStack_a0.buffer._M_elems[0x2e] = 0;
  SStack_a0.buffer._M_elems[0x2f] = 0;
  SStack_a0.buffer._M_elems[0x30] = 0;
  SStack_a0.buffer._M_elems[0x31] = 0;
  SStack_a0.buffer._M_elems[0x32] = 0;
  SStack_a0.buffer._M_elems[0x33] = 0;
  SStack_a0.buffer._M_elems[0x34] = 0;
  SStack_a0.buffer._M_elems[0x35] = 0;
  SStack_a0.buffer._M_elems[0x36] = 0;
  SStack_a0.buffer._M_elems[0x37] = 0;
  SStack_a0.buffer._M_elems[0x38] = 0;
  SStack_a0.buffer._M_elems[0x39] = 0;
  SStack_a0.buffer._M_elems[0x3a] = 0;
  SStack_a0.buffer._M_elems[0x3b] = 0;
  SStack_a0.buffer._M_elems[0x3c] = 0;
  SStack_a0.buffer._M_elems[0x3d] = 0;
  SStack_a0.buffer._M_elems[0x3e] = 0;
  SStack_a0.buffer._M_elems[0x3f] = 0;
  SStack_a0.bufferSize = 0;
  SStack_a0.bufferCapacity = 0x40;
  SStack_a0.nonOwning = false;
  SStack_a0.locked = false;
  SStack_a0.usingAllocatedBuffer = false;
  SStack_a0.errorCondition = '\0';
  SStack_a0.userKey = 0;
  pbStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pbStack_30 = (pointer)0x0;
  local_e0._8_8_ =
       (puVar7->_M_t).
       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>._M_t.
       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>.
       super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  local_c8 = (ulong)CONCAT22(uVar2,(short)*(char *)((long)&puVar7[1]._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                                  .
                                                  super__Head_base<0UL,_helics::BrokerObject_*,_false>
                                                  ._M_head_impl + 4)) | 0x20000;
  if (((SmallBuffer *)SStack_a0.heap != (SmallBuffer *)dest._M_str) &&
     (SmallBuffer::reserve((SmallBuffer *)SStack_a0.heap,sVar9), sVar9 != 0)) {
    SStack_a0.bufferSize = sVar9;
    memcpy(SStack_a0.heap,(SmallBuffer *)dest._M_str,sVar9);
    sVar9 = SStack_a0.bufferSize;
  }
  SStack_a0.bufferSize = sVar9;
  bVar1 = *(byte *)((long)&puVar7[1]._M_t.
                           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4);
  if (bVar1 < 0x70) {
    if (bVar1 == 0x65) {
      ActionMessage::setAction
                ((ActionMessage *)local_e0,(uint)(hint != FILTER) * 2 + cmd_add_named_filter);
      goto LAB_00303c6c;
    }
    if (bVar1 == 0x66) {
      ActionMessage::setAction((ActionMessage *)local_e0,cmd_add_named_endpoint);
      if (puVar7[3]._M_t.
          super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
          _M_t.
          super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
          .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl == (BrokerObject *)0x0)
      {
        pBVar3 = puVar7[0xe]._M_t.
                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        pBVar4 = puVar7[0xf]._M_t.
                 super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                 .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(pBVar3->brokerptr).
                         super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi
        ;
        p_Var6 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(pBVar4->brokerptr).
                         super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi
        ;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
            p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          string1._M_str =
               *(char **)&(pBVar3->brokerptr).
                          super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
          string1._M_len = (size_t)p_Var5;
          string2._M_str =
               *(char **)&(pBVar4->brokerptr).
                          super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
          string2._M_len = (size_t)p_Var6;
          ActionMessage::setStringData((ActionMessage *)local_e0,string1,string2);
        }
      }
      if (((ulong)puVar7[1]._M_t.
                  super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                  .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl &
          0x200000000000000) != 0) {
        local_c8 = local_c8 | 0x2000000;
      }
      goto LAB_00303ccd;
    }
  }
  else {
    if (bVar1 == 0x70) {
      ActionMessage::setAction((ActionMessage *)local_e0,cmd_add_named_input);
LAB_00303c6c:
      if (puVar7[3]._M_t.
          super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
          _M_t.
          super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
          .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl == (BrokerObject *)0x0)
      {
        string1_00._M_str =
             (char *)puVar7[6]._M_t.
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        string1_00._M_len =
             (size_t)puVar7[7]._M_t.
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        string2_00._M_str =
             (char *)puVar7[10]._M_t.
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        string2_00._M_len =
             (size_t)puVar7[0xb]._M_t.
                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
        ActionMessage::setStringData((ActionMessage *)local_e0,string1_00,string2_00);
      }
LAB_00303ccd:
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e0);
      ActionMessage::~ActionMessage((ActionMessage *)local_e0);
      return;
    }
    if (bVar1 == 0x74) {
      newAction = cmd_add_named_input;
      if ((char)hint < 'i') {
        if (hint == ENDPOINT) {
          newAction = cmd_add_named_endpoint;
        }
        else {
          if (hint != FILTER) goto LAB_00303c9d;
          newAction = cmd_add_named_filter;
        }
      }
      else if (hint != INPUT) {
        if (hint == PUBLICATION) {
          this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
          pcVar8 = "translators cannot have publications as destination targets";
          sVar9 = 0x3b;
          goto LAB_00303d9e;
        }
LAB_00303c9d:
        ActionMessage::setAction((ActionMessage *)local_e0,cmd_add_named_endpoint);
        BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e0);
      }
      ActionMessage::setAction((ActionMessage *)local_e0,newAction);
      goto LAB_00303ccd;
    }
    if (bVar1 == 0x73) {
      this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
      pcVar8 = "Data sinks cannot have destination targets";
      sVar9 = 0x2a;
      goto LAB_00303d9e;
    }
  }
  this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
  pcVar8 = "inputs cannot have destination targets";
  sVar9 = 0x26;
LAB_00303d9e:
  message_00._M_str = pcVar8;
  message_00._M_len = sVar9;
  HelicsException::HelicsException(this_01,message_00);
  *(undefined ***)this_01 = &PTR__HelicsException_0053f648;
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::addDestinationTarget(InterfaceHandle handle,
                                      std::string_view dest,
                                      InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, receive_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.flags = handleInfo->flags;
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    setActionFlag(cmd, destination_target);
    cmd.payload = dest;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::INPUT:
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
                case InterfaceType::PUBLICATION:
                    throw(InvalidIdentifier(
                        "translators cannot have publications as destination targets"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators have two outputs
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    // need to send 2 messages then one now and one at the end
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_ADD_NAMED_INPUT);
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::SINK:
            throw(InvalidIdentifier("Data sinks cannot have destination targets"));
        case InterfaceType::INPUT:
        default:
            throw(InvalidIdentifier("inputs cannot have destination targets"));
    }

    addActionMessage(std::move(cmd));
}